

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

unsigned_long flatbuffers::JsonPrinter::GetFieldDefault<unsigned_long>(FieldDef *fd)

{
  char *pcVar1;
  char *str;
  bool bVar2;
  char *pcVar3;
  unsigned_long val;
  unsigned_long local_10;
  
  local_10 = 0;
  str = (fd->value).constant._M_dataplus._M_p;
  bVar2 = StringToIntegerImpl<unsigned_long>(&local_10,str,0,true);
  if (!bVar2) {
LAB_00159f51:
    __assert_fail("check",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0xfb,
                  "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = unsigned long]"
                 );
  }
  if (local_10 != 0) {
    pcVar3 = str + -1;
    do {
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
      if (*pcVar1 == '\0') break;
    } while (9 < (int)*pcVar1 - 0x30U);
    if (pcVar3[-(ulong)(str < pcVar3)] == '-') {
      local_10 = 0xffffffffffffffff;
      goto LAB_00159f51;
    }
  }
  return local_10;
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }